

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall
SQVM::StartCall(SQVM *this,SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,
               bool tailcall)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  uint uVar3;
  uint uVar4;
  SQObjectType SVar5;
  SQObjectType SVar6;
  SQFunctionProto *pSVar7;
  long lVar8;
  SQSharedState *pSVar9;
  SQObjectPtr *pSVar10;
  SQObjectPtr *pSVar11;
  long *plVar12;
  SQTable *pSVar13;
  SQWeakRef *pSVar14;
  CallInfo *pCVar15;
  bool bVar16;
  SQArray *this_00;
  SQGenerator *this_01;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  SQObjectPtr temp;
  SQObjectPtr local_40;
  
  pSVar7 = closure->_function;
  lVar19 = pSVar7->_nparameters;
  lVar8 = pSVar7->_stacksize;
  if (pSVar7->_varparams == 0) {
    if (lVar19 != args) {
      lVar17 = pSVar7->_ndefaultparams;
      lVar20 = lVar19 - args;
      if (((lVar20 == 0 || lVar19 < args) || lVar17 == 0) ||
         (lVar19 = lVar17 - lVar20, lVar17 < lVar20)) goto LAB_0015b8e8;
      if (0 < lVar20) {
        lVar20 = args * 0x10 + stackbase * 0x10;
        uVar22 = lVar19 * 0x10 | 8;
        do {
          pSVar10 = closure->_defaultparams;
          pSVar11 = (this->_stack)._vals;
          uVar3 = *(uint *)((long)&(pSVar11->super_SQObject)._type + lVar20);
          plVar12 = *(long **)((long)&(pSVar11->super_SQObject)._unVal + lVar20);
          *(undefined8 *)((long)&(pSVar11->super_SQObject)._unVal + lVar20) =
               *(undefined8 *)((long)&(pSVar10->super_SQObject)._type + uVar22);
          uVar4 = *(uint *)((long)pSVar10 + (uVar22 - 8));
          *(uint *)((long)&(pSVar11->super_SQObject)._type + lVar20) = uVar4;
          if ((uVar4 >> 0x1b & 1) != 0) {
            plVar1 = (long *)(*(long *)((long)&(pSVar11->super_SQObject)._unVal + lVar20) + 8);
            *plVar1 = *plVar1 + 1;
          }
          if ((uVar3 >> 0x1b & 1) != 0) {
            plVar1 = plVar12 + 1;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (**(code **)(*plVar12 + 0x10))();
            }
          }
          lVar19 = lVar19 + 1;
          lVar20 = lVar20 + 0x10;
          uVar22 = uVar22 + 0x10;
        } while (lVar19 < lVar17);
      }
    }
  }
  else {
    lVar17 = lVar19 + -1;
    lVar20 = args - lVar17;
    if (args < lVar17) {
LAB_0015b8e8:
      Raise_Error(this,"wrong number of parameters");
      return false;
    }
    pSVar9 = this->_sharedstate;
    this_00 = (SQArray *)sq_vm_malloc(0x48);
    SQArray::SQArray(this_00,pSVar9,lVar20);
    lVar17 = lVar17 + stackbase;
    if (0 < lVar20) {
      lVar18 = lVar17 * 0x10;
      lVar21 = (lVar19 + stackbase) * 0x10 + -8;
      lVar19 = 8;
      do {
        pSVar10 = (this->_stack)._vals;
        pSVar11 = (this_00->_values)._vals;
        uVar3 = *(uint *)((long)pSVar11 + lVar19 + -8);
        plVar12 = *(long **)((long)&(pSVar11->super_SQObject)._type + lVar19);
        *(undefined8 *)((long)&(pSVar11->super_SQObject)._type + lVar19) =
             *(undefined8 *)((long)&(pSVar10->super_SQObject)._type + lVar21);
        uVar4 = *(uint *)((long)&(pSVar10->super_SQObject)._type + lVar18);
        *(uint *)((long)pSVar11 + lVar19 + -8) = uVar4;
        if ((uVar4 >> 0x1b & 1) != 0) {
          plVar1 = (long *)(*(long *)((long)&(pSVar11->super_SQObject)._type + lVar19) + 8);
          *plVar1 = *plVar1 + 1;
        }
        if ((uVar3 >> 0x1b & 1) != 0) {
          plVar1 = plVar12 + 1;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (**(code **)(*plVar12 + 0x10))();
          }
        }
        pSVar10 = (this->_stack)._vals;
        plVar12 = *(long **)((long)&(pSVar10->super_SQObject)._type + lVar21);
        uVar3 = *(uint *)((long)&(pSVar10->super_SQObject)._type + lVar18);
        *(undefined4 *)((long)&(pSVar10->super_SQObject)._type + lVar18) = 0x1000001;
        *(undefined8 *)((long)&(pSVar10->super_SQObject)._type + lVar21) = 0;
        if ((uVar3 >> 0x1b & 1) != 0) {
          plVar1 = plVar12 + 1;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (**(code **)(*plVar12 + 0x10))();
          }
        }
        lVar18 = lVar18 + 0x10;
        lVar21 = lVar21 + 0x10;
        lVar19 = lVar19 + 0x10;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
    }
    pSVar10 = (this->_stack)._vals;
    pSVar13 = pSVar10[lVar17].super_SQObject._unVal.pTable;
    SVar5 = pSVar10[lVar17].super_SQObject._type;
    pSVar10[lVar17].super_SQObject._type = OT_ARRAY;
    pSVar10[lVar17].super_SQObject._unVal.pArray = this_00;
    pSVar2 = &(this_00->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 + 1;
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 - 1;
      if (*pSVar2 == 0) {
        (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  pSVar14 = closure->_env;
  if (pSVar14 != (SQWeakRef *)0x0) {
    pSVar10 = (this->_stack)._vals;
    SVar5 = pSVar10[stackbase].super_SQObject._type;
    pSVar13 = pSVar10[stackbase].super_SQObject._unVal.pTable;
    pSVar10[stackbase].super_SQObject._unVal = (pSVar14->_obj)._unVal;
    SVar6 = (pSVar14->_obj)._type;
    pSVar10[stackbase].super_SQObject._type = SVar6;
    if ((SVar6 >> 0x1b & 1) != 0) {
      pSVar2 = &((pSVar10[stackbase].super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 + 1;
    }
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 - 1;
      if (*pSVar2 == 0) {
        (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  bVar16 = EnterFrame(this,stackbase,lVar8 + stackbase,tailcall);
  if (bVar16) {
    pCVar15 = this->ci;
    pSVar13 = (pCVar15->_closure).super_SQObject._unVal.pTable;
    SVar5 = (pCVar15->_closure).super_SQObject._type;
    (pCVar15->_closure).super_SQObject._type = OT_CLOSURE;
    (pCVar15->_closure).super_SQObject._unVal.pClosure = closure;
    pSVar2 = &(closure->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 + 1;
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar2 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 - 1;
      if (*pSVar2 == 0) {
        (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    pCVar15 = this->ci;
    pCVar15->_literals = pSVar7->_literals;
    pCVar15->_ip = pSVar7->_instructions;
    pCVar15->_target = (SQInt32)target;
    if (this->_debughook == true) {
      CallDebugHook(this,99,0);
    }
    pSVar7 = closure->_function;
    if (pSVar7->_bgenerator != true) {
      return true;
    }
    pSVar9 = this->_sharedstate;
    this_01 = (SQGenerator *)sq_vm_malloc(0xc0);
    SQGenerator::SQGenerator(this_01,pSVar9,closure);
    bVar16 = SQGenerator::Yield(this_01,this,pSVar7->_stacksize);
    if (bVar16) {
      local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
      local_40.super_SQObject._type = OT_NULL;
      Return(this,1,target,&local_40);
      lVar19 = this->_stackbase;
      pSVar10 = (this->_stack)._vals;
      pSVar13 = pSVar10[lVar19 + target].super_SQObject._unVal.pTable;
      SVar5 = pSVar10[lVar19 + target].super_SQObject._type;
      pSVar10[lVar19 + target].super_SQObject._type = OT_GENERATOR;
      pSVar10[lVar19 + target].super_SQObject._unVal.pGenerator = this_01;
      pSVar2 = &(this_01->super_SQCollectable).super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 + 1;
      if ((SVar5 >> 0x1b & 1) != 0) {
        pSVar2 = &(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar2 = *pSVar2 - 1;
        if (*pSVar2 == 0) {
          (*(pSVar13->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
            [2])();
        }
      }
      SQObjectPtr::~SQObjectPtr(&local_40);
      if (bVar16) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SQVM::StartCall(SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,bool tailcall)
{
    SQFunctionProto *func = closure->_function;

    SQInteger paramssize = func->_nparameters;
    const SQInteger newtop = stackbase + func->_stacksize;
    SQInteger nargs = args;
    if(func->_varparams)
    {
        paramssize--;
        if (nargs < paramssize) {
            Raise_Error(_SC("wrong number of parameters"));
            return false;
        }

        //dumpstack(stackbase);
        SQInteger nvargs = nargs - paramssize;
        SQArray *arr = SQArray::Create(_ss(this),nvargs);
        SQInteger pbase = stackbase+paramssize;
        for(SQInteger n = 0; n < nvargs; n++) {
            arr->_values[n] = _stack._vals[pbase];
            _stack._vals[pbase].Null();
            pbase++;

        }
        _stack._vals[stackbase+paramssize] = arr;
        //dumpstack(stackbase);
    }
    else if (paramssize != nargs) {
        SQInteger ndef = func->_ndefaultparams;
        SQInteger diff;
        if(ndef && nargs < paramssize && (diff = paramssize - nargs) <= ndef) {
            for(SQInteger n = ndef - diff; n < ndef; n++) {
                _stack._vals[stackbase + (nargs++)] = closure->_defaultparams[n];
            }
        }
        else {
            Raise_Error(_SC("wrong number of parameters"));
            return false;
        }
    }

    if(closure->_env) {
        _stack._vals[stackbase] = closure->_env->_obj;
    }

    if(!EnterFrame(stackbase, newtop, tailcall)) return false;

    ci->_closure  = closure;
    ci->_literals = func->_literals;
    ci->_ip       = func->_instructions;
    ci->_target   = (SQInt32)target;

    if (_debughook) {
        CallDebugHook(_SC('c'));
    }

    if (closure->_function->_bgenerator) {
        SQFunctionProto *f = closure->_function;
        SQGenerator *gen = SQGenerator::Create(_ss(this), closure);
        if(!gen->Yield(this,f->_stacksize))
            return false;
        SQObjectPtr temp;
        Return(1, target, temp);
        STK(target) = gen;
    }


    return true;
}